

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lj_crecord.c
# Opt level: O0

TRef crec_arith_ptr(jit_State *J,TRef *sp,CType **s,MMS mm)

{
  CTState *cts_00;
  int32_t k;
  short sVar1;
  ushort uVar2;
  CTSize CVar3;
  TRef TVar4;
  TRef TVar5;
  uint uVar6;
  CTypeID k_00;
  CTypeID id;
  CTSize sz_1;
  IRType t;
  TRef tr_2;
  TRef tr_1;
  IROp op;
  CTSize sz;
  TRef tr;
  CType *ctp;
  CTState *cts;
  MMS mm_local;
  CType **s_local;
  TRef *sp_local;
  jit_State *J_local;
  
  cts_00 = *(CTState **)&J[-1].penalty[0x3c].val;
  _sz = *s;
  if ((*sp == 0) || (sp[1] == 0)) {
    return 0;
  }
  if ((_sz->info >> 0x1c == 2) || ((_sz->info & 0xfc000000) == 0x30000000)) {
    if (((mm == MM_sub) || (((mm == MM_eq || (mm == MM_lt)) || (mm == MM_le)))) &&
       ((s[1]->info >> 0x1c == 2 || ((s[1]->info & 0xfc000000) == 0x30000000)))) {
      if (mm != MM_sub) {
        if (mm == MM_eq) {
          sVar1 = 8;
        }
        else {
          sVar1 = 6;
          if (mm == MM_lt) {
            sVar1 = 4;
          }
        }
        TVar4 = *sp;
        TVar5 = sp[1];
        (J->fold).ins.field_0.ot = sVar1 << 8 | 0x89;
        (J->fold).ins.field_0.op1 = (IRRef1)TVar4;
        (J->fold).ins.field_0.op2 = (IRRef1)TVar5;
        J->postproc = LJ_POST_FIXGUARD;
        return 0x2007ffd;
      }
      CVar3 = lj_ctype_size(cts_00,_sz->info & 0xffff);
      if ((CVar3 != 0) && ((CVar3 & CVar3 - 1) == 0)) {
        TVar4 = *sp;
        TVar5 = sp[1];
        (J->fold).ins.field_0.ot = 0x2a15;
        (J->fold).ins.field_0.op1 = (IRRef1)TVar4;
        (J->fold).ins.field_0.op2 = (IRRef1)TVar5;
        TVar4 = lj_opt_fold(J);
        k = 0x1f;
        if (CVar3 != 0) {
          for (; CVar3 >> k == 0; k = k + -1) {
          }
        }
        TVar5 = lj_ir_kint(J,k);
        (J->fold).ins.field_0.ot = 0x2615;
        (J->fold).ins.field_0.op1 = (IRRef1)TVar4;
        (J->fold).ins.field_0.op2 = (IRRef1)TVar5;
        TVar4 = lj_opt_fold(J);
        (J->fold).ins.field_0.ot = 0x5b0e;
        (J->fold).ins.field_0.op1 = (IRRef1)TVar4;
        (J->fold).ins.field_0.op2 = 0x1d5;
        TVar4 = lj_opt_fold(J);
        return TVar4;
      }
      return 0;
    }
    if (((mm != MM_add) && (mm != MM_sub)) || (s[1]->info >> 0x1c != 0)) {
      return 0;
    }
  }
  else {
    if (((mm != MM_add) || (_sz->info >> 0x1c != 0)) ||
       ((s[1]->info >> 0x1c != 2 && ((s[1]->info & 0xfc000000) != 0x30000000)))) {
      return 0;
    }
    TVar4 = *sp;
    *sp = sp[1];
    sp[1] = TVar4;
    _sz = s[1];
  }
  sz_1 = sp[1];
  uVar6 = sz_1 >> 0x18 & 0x1f;
  CVar3 = lj_ctype_size(cts_00,_sz->info & 0xffff);
  if ((uVar6 == 0xe) || (uVar6 == 0xd)) {
    (J->fold).ins.field_0.ot = 0x5b15;
    (J->fold).ins.field_0.op1 = (IRRef1)sz_1;
    (J->fold).ins.field_0.op2 = (ushort)uVar6 | 0x12a0;
    TVar4 = lj_opt_fold(J);
    sz_1._0_2_ = (IRRef1)TVar4;
  }
  else {
    if ((uVar6 != 0x15) && (uVar6 != 0x16)) {
      uVar2 = 0x800;
      if ((uVar6 - 0xf & 1) != 0) {
        uVar2 = 0;
      }
      (J->fold).ins.field_0.ot = 0x5b15;
      (J->fold).ins.field_0.op1 = (IRRef1)sz_1;
      (J->fold).ins.field_0.op2 = uVar2 | 0x2b3;
      sz_1 = lj_opt_fold(J);
    }
  }
  TVar4 = lj_ir_kint64(J,(ulong)CVar3);
  (J->fold).ins.field_0.ot = 0x2b15;
  (J->fold).ins.field_0.op1 = (IRRef1)sz_1;
  (J->fold).ins.field_0.op2 = (IRRef1)TVar4;
  TVar5 = lj_opt_fold(J);
  TVar4 = *sp;
  (J->fold).ins.field_0.ot = ((short)mm + 0x1f) * 0x100 | 9;
  (J->fold).ins.field_0.op1 = (IRRef1)TVar4;
  (J->fold).ins.field_0.op2 = (IRRef1)TVar5;
  TVar4 = lj_opt_fold(J);
  k_00 = lj_ctype_intern(cts_00,(_sz->info & 0xffff | 0x30000) + 0x20000000,8);
  TVar5 = lj_ir_kint(J,k_00);
  (J->fold).ins.field_0.ot = 0x548a;
  (J->fold).ins.field_0.op1 = (IRRef1)TVar5;
  (J->fold).ins.field_0.op2 = (IRRef1)TVar4;
  TVar4 = lj_opt_fold(J);
  return TVar4;
}

Assistant:

static TRef crec_arith_ptr(jit_State *J, TRef *sp, CType **s, MMS mm)
{
  CTState *cts = ctype_ctsG(J2G(J));
  CType *ctp = s[0];
  if (!(sp[0] && sp[1])) return 0;
  if (ctype_isptr(ctp->info) || ctype_isrefarray(ctp->info)) {
    if ((mm == MM_sub || mm == MM_eq || mm == MM_lt || mm == MM_le) &&
	(ctype_isptr(s[1]->info) || ctype_isrefarray(s[1]->info))) {
      if (mm == MM_sub) {  /* Pointer difference. */
	TRef tr;
	CTSize sz = lj_ctype_size(cts, ctype_cid(ctp->info));
	if (sz == 0 || (sz & (sz-1)) != 0)
	  return 0;  /* NYI: integer division. */
	tr = emitir(IRT(IR_SUB, IRT_INTP), sp[0], sp[1]);
	tr = emitir(IRT(IR_BSAR, IRT_INTP), tr, lj_ir_kint(J, lj_fls(sz)));
#if LJ_64
	tr = emitconv(tr, IRT_NUM, IRT_INTP, 0);
#endif
	return tr;
      } else {  /* Pointer comparison (unsigned). */
	/* Assume true comparison. Fixup and emit pending guard later. */
	IROp op = mm == MM_eq ? IR_EQ : mm == MM_lt ? IR_ULT : IR_ULE;
	lj_ir_set(J, IRTG(op, IRT_PTR), sp[0], sp[1]);
	J->postproc = LJ_POST_FIXGUARD;
	return TREF_TRUE;
      }
    }
    if (!((mm == MM_add || mm == MM_sub) && ctype_isnum(s[1]->info)))
      return 0;
  } else if (mm == MM_add && ctype_isnum(ctp->info) &&
	     (ctype_isptr(s[1]->info) || ctype_isrefarray(s[1]->info))) {
    TRef tr = sp[0]; sp[0] = sp[1]; sp[1] = tr;  /* Swap pointer and index. */
    ctp = s[1];
  } else {
    return 0;
  }
  {
    TRef tr = sp[1];
    IRType t = tref_type(tr);
    CTSize sz = lj_ctype_size(cts, ctype_cid(ctp->info));
    CTypeID id;
#if LJ_64
    if (t == IRT_NUM || t == IRT_FLOAT)
      tr = emitconv(tr, IRT_INTP, t, IRCONV_ANY);
    else if (!(t == IRT_I64 || t == IRT_U64))
      tr = emitconv(tr, IRT_INTP, IRT_INT,
		    ((t - IRT_I8) & 1) ? 0 : IRCONV_SEXT);
#else
    if (!tref_typerange(sp[1], IRT_I8, IRT_U32)) {
      tr = emitconv(tr, IRT_INTP, t,
		    (t == IRT_NUM || t == IRT_FLOAT) ? IRCONV_ANY : 0);
    }
#endif
    tr = emitir(IRT(IR_MUL, IRT_INTP), tr, lj_ir_kintp(J, sz));
    tr = emitir(IRT(mm+(int)IR_ADD-(int)MM_add, IRT_PTR), sp[0], tr);
    id = lj_ctype_intern(cts, CTINFO(CT_PTR, CTALIGN_PTR|ctype_cid(ctp->info)),
			 CTSIZE_PTR);
    return emitir(IRTG(IR_CNEWI, IRT_CDATA), lj_ir_kint(J, id), tr);
  }
}